

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.h
# Opt level: O3

bool qFuzzyCompare(QPointF *p1,QPointF *p2)

{
  bool bVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = p1->xp;
  dVar3 = p2->xp;
  dVar4 = dVar5 - dVar3;
  uVar2 = -(ulong)(dVar4 < -dVar4);
  dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)-dVar4 & uVar2);
  if (((dVar5 == 0.0) && (!NAN(dVar5))) || ((dVar3 == 0.0 && (!NAN(dVar3))))) {
    if (1e-12 < dVar4) {
      return false;
    }
  }
  else {
    uVar2 = -(ulong)(dVar5 < -dVar5);
    dVar5 = (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2);
    uVar2 = -(ulong)(dVar3 < -dVar3);
    dVar3 = (double)(~uVar2 & (ulong)dVar3 | (ulong)-dVar3 & uVar2);
    if (dVar3 <= dVar5) {
      dVar5 = dVar3;
    }
    if (dVar5 < dVar4 * 1000000000000.0) {
      return false;
    }
  }
  dVar5 = p1->yp;
  dVar3 = p2->yp;
  dVar4 = dVar5 - dVar3;
  uVar2 = -(ulong)(dVar4 < -dVar4);
  dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)-dVar4 & uVar2);
  if (((dVar5 == 0.0) && (!NAN(dVar5))) || ((dVar3 == 0.0 && (!NAN(dVar3))))) {
    bVar1 = 1e-12 < dVar4;
  }
  else {
    uVar2 = -(ulong)(dVar5 < -dVar5);
    dVar5 = (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2);
    uVar2 = -(ulong)(dVar3 < -dVar3);
    dVar3 = (double)(~uVar2 & (ulong)dVar3 | (ulong)-dVar3 & uVar2);
    if (dVar3 <= dVar5) {
      dVar5 = dVar3;
    }
    bVar1 = dVar5 < dVar4 * 1000000000000.0;
  }
  return !bVar1;
}

Assistant:

constexpr bool qFuzzyCompare(const QPointF &p1, const QPointF &p2) noexcept
    {
        return ((!p1.xp || !p2.xp) ? qFuzzyIsNull(p1.xp - p2.xp) : qFuzzyCompare(p1.xp, p2.xp))
            && ((!p1.yp || !p2.yp) ? qFuzzyIsNull(p1.yp - p2.yp) : qFuzzyCompare(p1.yp, p2.yp));
    }